

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNCodeBody::show_disassembly
          (CTPNCodeBody *this,unsigned_long start_ofs,unsigned_long code_start_ofs,
          unsigned_long code_end_ofs)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  CTcUnasSrc *src_00;
  char *pcVar6;
  long in_RSI;
  CTcUnasSrcCodeBody exc_src;
  unsigned_long exc_end_ofs;
  unsigned_long exc_ofs;
  CTcUnasSrcCodeBody src;
  uint dbg_rel;
  uint exc_rel;
  int total_stk;
  int locals;
  int argc;
  CTcUnasOut *in_stack_ffffffffffffff38;
  CTcDataStream *in_stack_ffffffffffffff40;
  CTcUnasOut *code_start_ofs_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar7;
  CTcCodeStream **this_00;
  unsigned_long in_stack_ffffffffffffff80;
  CTcUnasOut *out;
  
  this_00 = &G_cs;
  bVar1 = CTcDataStream::get_byte_at(in_stack_ffffffffffffff40,(ulong)in_stack_ffffffffffffff38);
  uVar2 = CTcDataStream::readu2_at
                    ((CTcDataStream *)this_00,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  uVar3 = CTcDataStream::readu2_at
                    ((CTcDataStream *)this_00,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  uVar4 = CTcDataStream::readu2_at
                    ((CTcDataStream *)this_00,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  uVar5 = CTcDataStream::readu2_at
                    ((CTcDataStream *)this_00,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  uVar7 = 0;
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"%8lx .code\n",in_RSI);
  pcVar6 = "";
  if ((char)bVar1 < '\0') {
    pcVar6 = "+";
  }
  (*G_disasm_out->_vptr_CTcUnasOut[2])
            (G_disasm_out,"         .argcount %d%s\n",(ulong)(bVar1 & 0x7f),pcVar6);
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"         .locals %d\n",(ulong)uVar2);
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"         .maxstack %d\n",(ulong)uVar3);
  CTcUnasSrcCodeBody::CTcUnasSrcCodeBody
            ((CTcUnasSrcCodeBody *)this_00,
             (CTcCodeStream *)CONCAT17(uVar7,in_stack_ffffffffffffff48),
             (unsigned_long)in_stack_ffffffffffffff40,(unsigned_long)in_stack_ffffffffffffff38);
  CTcT3Unasm::disasm((CTcUnasSrc *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (uVar4 != 0) {
    src_00 = (CTcUnasSrc *)(in_RSI + (ulong)uVar4);
    if (uVar5 == 0) {
      in_stack_ffffffffffffff38 = (CTcUnasOut *)CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
      code_start_ofs_00 = in_stack_ffffffffffffff38;
    }
    else {
      code_start_ofs_00 = (CTcUnasOut *)(in_RSI + (ulong)uVar5);
    }
    out = code_start_ofs_00;
    (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,".exceptions\n");
    CTcUnasSrcCodeBody::CTcUnasSrcCodeBody
              ((CTcUnasSrcCodeBody *)this_00,
               (CTcCodeStream *)CONCAT17(uVar7,in_stack_ffffffffffffff48),
               (unsigned_long)code_start_ofs_00,(unsigned_long)in_stack_ffffffffffffff38);
    CTcT3Unasm::show_exc_table(src_00,out,in_stack_ffffffffffffff80);
    CTcUnasSrcCodeBody::~CTcUnasSrcCodeBody((CTcUnasSrcCodeBody *)0x287478);
  }
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"\n");
  CTcUnasSrcCodeBody::~CTcUnasSrcCodeBody((CTcUnasSrcCodeBody *)0x2874cc);
  return;
}

Assistant:

void CTPNCodeBody::show_disassembly(unsigned long start_ofs,
                                    unsigned long code_start_ofs,
                                    unsigned long code_end_ofs)
{
    int argc;
    int locals;
    int total_stk;
    unsigned exc_rel;
    unsigned dbg_rel;

    /* first, dump the header */
    argc = (unsigned char)G_cs->get_byte_at(start_ofs);
    locals = G_cs->readu2_at(start_ofs + 2);
    total_stk = G_cs->readu2_at(start_ofs + 4);
    exc_rel = G_cs->readu2_at(start_ofs + 6);
    dbg_rel = G_cs->readu2_at(start_ofs + 8);
    G_disasm_out->print("%8lx .code\n", start_ofs);
    G_disasm_out->print("         .argcount %d%s\n",
                        (argc & 0x7f),
                        (argc & 0x80) != 0 ? "+" : "");
    G_disasm_out->print("         .locals %d\n", locals);
    G_disasm_out->print("         .maxstack %d\n", total_stk);

    /* set up a code stream reader and dump the code stream */
    CTcUnasSrcCodeBody src(G_cs, code_start_ofs, code_end_ofs);
    CTcT3Unasm::disasm(&src, G_disasm_out);

    /* show the exception table, if there is one */
    if (exc_rel != 0)
    {
        unsigned long exc_ofs;
        unsigned long exc_end_ofs;

        /* get the starting address */
        exc_ofs = start_ofs + exc_rel;

        /* 
         *   get the length - it's the part up to the debug records, or the
         *   part up to the current code offset if there are no debug records
         */
        exc_end_ofs = (dbg_rel != 0 ? start_ofs + dbg_rel : G_cs->get_ofs());

        /* show the table */
        G_disasm_out->print(".exceptions\n");
        CTcUnasSrcCodeBody exc_src(G_cs, exc_ofs, exc_end_ofs);
        CTcT3Unasm::show_exc_table(&exc_src, G_disasm_out, start_ofs);
    }

    /* add a blank line at the end */
    G_disasm_out->print("\n");
}